

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp_id_GostR3410_2001_CryptoPro_C_ParamSet.c
# Opt level: O1

void fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_inv(uint64_t *output,uint64_t *t1)

{
  int iVar1;
  fe_t_conflict acc;
  fe_t_conflict t25;
  fe_t_conflict t15;
  fe_t_conflict t11;
  fe_t_conflict t29;
  fe_t_conflict t21;
  fe_t_conflict t7;
  fe_t_conflict t3;
  fe_t_conflict t23;
  fe_t_conflict t13;
  fe_t_conflict t9;
  fe_t_conflict t5;
  fe_t_conflict t31;
  fe_t_conflict t27;
  fe_t_conflict t19;
  fe_t_conflict t17;
  uint64_t auStack_238 [4];
  uint64_t local_218 [4];
  uint64_t local_1f8 [4];
  uint64_t local_1d8 [4];
  uint64_t local_1b8 [4];
  uint64_t local_198 [4];
  uint64_t local_178 [4];
  uint64_t local_158 [4];
  uint64_t local_138 [4];
  uint64_t local_118 [4];
  uint64_t local_f8 [4];
  uint64_t local_d8 [4];
  uint64_t local_b8 [4];
  uint64_t local_98 [4];
  uint64_t local_78 [4];
  uint64_t local_58 [5];
  
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_square(auStack_238,t1);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(local_158,t1,auStack_238);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(local_d8,local_158,auStack_238);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(local_178,local_d8,auStack_238);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(local_f8,local_178,auStack_238);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(local_1d8,local_f8,auStack_238);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(local_118,local_1d8,auStack_238);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(local_1f8,local_118,auStack_238);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(local_58,local_1f8,auStack_238);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(local_78,local_58,auStack_238);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(local_198,local_78,auStack_238);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(local_138,local_198,auStack_238);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(local_218,local_138,auStack_238);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(local_98,local_218,auStack_238);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(local_1b8,local_98,auStack_238);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(local_b8,local_1b8,auStack_238);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_square(auStack_238,local_f8);
  iVar1 = 4;
  do {
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_square(auStack_238,auStack_238);
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(auStack_238,auStack_238,local_138);
  iVar1 = 5;
  do {
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_square(auStack_238,auStack_238);
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(auStack_238,auStack_238,local_178);
  iVar1 = 5;
  do {
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_square(auStack_238,auStack_238);
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(auStack_238,auStack_238,local_98);
  iVar1 = 7;
  do {
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_square(auStack_238,auStack_238);
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(auStack_238,auStack_238,t1);
  iVar1 = 5;
  do {
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_square(auStack_238,auStack_238);
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(auStack_238,auStack_238,local_1f8);
  iVar1 = 5;
  do {
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_square(auStack_238,auStack_238);
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(auStack_238,auStack_238,local_198);
  iVar1 = 5;
  do {
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_square(auStack_238,auStack_238);
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(auStack_238,auStack_238,local_198);
  iVar1 = 8;
  do {
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_square(auStack_238,auStack_238);
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(auStack_238,auStack_238,local_1d8);
  iVar1 = 7;
  do {
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_square(auStack_238,auStack_238);
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(auStack_238,auStack_238,t1);
  iVar1 = 6;
  do {
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_square(auStack_238,auStack_238);
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(auStack_238,auStack_238,t1);
  iVar1 = 5;
  do {
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_square(auStack_238,auStack_238);
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(auStack_238,auStack_238,local_1b8);
  iVar1 = 5;
  do {
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_square(auStack_238,auStack_238);
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(auStack_238,auStack_238,local_1d8);
  iVar1 = 7;
  do {
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_square(auStack_238,auStack_238);
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(auStack_238,auStack_238,local_1f8);
  iVar1 = 6;
  do {
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_square(auStack_238,auStack_238);
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(auStack_238,auStack_238,local_218);
  iVar1 = 5;
  do {
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_square(auStack_238,auStack_238);
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(auStack_238,auStack_238,t1);
  iVar1 = 5;
  do {
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_square(auStack_238,auStack_238);
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(auStack_238,auStack_238,local_1f8);
  iVar1 = 6;
  do {
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_square(auStack_238,auStack_238);
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(auStack_238,auStack_238,local_118);
  iVar1 = 5;
  do {
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_square(auStack_238,auStack_238);
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(auStack_238,auStack_238,local_118);
  iVar1 = 6;
  do {
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_square(auStack_238,auStack_238);
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(auStack_238,auStack_238,t1);
  iVar1 = 5;
  do {
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_square(auStack_238,auStack_238);
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(auStack_238,auStack_238,local_218);
  iVar1 = 8;
  do {
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_square(auStack_238,auStack_238);
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(auStack_238,auStack_238,local_198);
  iVar1 = 5;
  do {
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_square(auStack_238,auStack_238);
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(auStack_238,auStack_238,local_1d8);
  iVar1 = 7;
  do {
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_square(auStack_238,auStack_238);
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(auStack_238,auStack_238,local_b8);
  iVar1 = 5;
  do {
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_square(auStack_238,auStack_238);
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(auStack_238,auStack_238,t1);
  iVar1 = 5;
  do {
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_square(auStack_238,auStack_238);
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(auStack_238,auStack_238,local_158);
  iVar1 = 6;
  do {
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_square(auStack_238,auStack_238);
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(auStack_238,auStack_238,local_1b8);
  iVar1 = 6;
  do {
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_square(auStack_238,auStack_238);
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(auStack_238,auStack_238,local_158);
  iVar1 = 6;
  do {
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_square(auStack_238,auStack_238);
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(auStack_238,auStack_238,local_1f8);
  iVar1 = 7;
  do {
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_square(auStack_238,auStack_238);
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(auStack_238,auStack_238,local_f8);
  iVar1 = 8;
  do {
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_square(auStack_238,auStack_238);
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(auStack_238,auStack_238,local_d8);
  iVar1 = 6;
  do {
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_square(auStack_238,auStack_238);
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(auStack_238,auStack_238,local_178);
  iVar1 = 6;
  do {
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_square(auStack_238,auStack_238);
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(auStack_238,auStack_238,local_78);
  iVar1 = 5;
  do {
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_square(auStack_238,auStack_238);
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(auStack_238,auStack_238,local_1f8);
  iVar1 = 7;
  do {
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_square(auStack_238,auStack_238);
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(auStack_238,auStack_238,local_218);
  iVar1 = 5;
  do {
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_square(auStack_238,auStack_238);
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(auStack_238,auStack_238,local_58);
  iVar1 = 5;
  do {
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_square(auStack_238,auStack_238);
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(auStack_238,auStack_238,local_1b8);
  iVar1 = 5;
  do {
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_square(auStack_238,auStack_238);
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(auStack_238,auStack_238,local_1b8);
  iVar1 = 5;
  do {
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_square(auStack_238,auStack_238);
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(auStack_238,auStack_238,local_218);
  iVar1 = 7;
  do {
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_square(auStack_238,auStack_238);
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(auStack_238,auStack_238,t1);
  iVar1 = 7;
  do {
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_square(auStack_238,auStack_238);
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(auStack_238,auStack_238,local_1d8);
  iVar1 = 6;
  do {
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_square(auStack_238,auStack_238);
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(auStack_238,auStack_238,local_138);
  iVar1 = 5;
  do {
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_square(auStack_238,auStack_238);
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(auStack_238,auStack_238,local_1d8);
  iVar1 = 7;
  do {
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_square(auStack_238,auStack_238);
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(output,auStack_238,local_218);
  return;
}

Assistant:

static void fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_inv(fe_t output,
                                                            const fe_t t1) {
    int i;
    /* temporary variables */
    fe_t acc, t11, t13, t15, t17, t19, t21, t23, t25, t27, t29, t3, t31, t5, t7,
        t9;

    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_square(acc, t1);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(t3, t1, acc);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(t5, t3, acc);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(t7, t5, acc);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(t9, t7, acc);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(t11, t9, acc);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(t13, t11, acc);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(t15, t13, acc);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(t17, t15, acc);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(t19, t17, acc);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(t21, t19, acc);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(t23, t21, acc);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(t25, t23, acc);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(t27, t25, acc);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(t29, t27, acc);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(t31, t29, acc);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_square(acc, t9);
    for (i = 0; i < 4; i++)
        fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_square(acc, acc);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(acc, acc, t23);
    for (i = 0; i < 5; i++)
        fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_square(acc, acc);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(acc, acc, t7);
    for (i = 0; i < 5; i++)
        fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_square(acc, acc);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(acc, acc, t27);
    for (i = 0; i < 7; i++)
        fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_square(acc, acc);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(acc, acc, t1);
    for (i = 0; i < 5; i++)
        fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_square(acc, acc);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(acc, acc, t15);
    for (i = 0; i < 5; i++)
        fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_square(acc, acc);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(acc, acc, t21);
    for (i = 0; i < 5; i++)
        fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_square(acc, acc);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(acc, acc, t21);
    for (i = 0; i < 8; i++)
        fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_square(acc, acc);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(acc, acc, t11);
    for (i = 0; i < 7; i++)
        fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_square(acc, acc);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(acc, acc, t1);
    for (i = 0; i < 6; i++)
        fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_square(acc, acc);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(acc, acc, t1);
    for (i = 0; i < 5; i++)
        fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_square(acc, acc);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(acc, acc, t29);
    for (i = 0; i < 5; i++)
        fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_square(acc, acc);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(acc, acc, t11);
    for (i = 0; i < 7; i++)
        fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_square(acc, acc);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(acc, acc, t15);
    for (i = 0; i < 6; i++)
        fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_square(acc, acc);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(acc, acc, t25);
    for (i = 0; i < 5; i++)
        fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_square(acc, acc);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(acc, acc, t1);
    for (i = 0; i < 5; i++)
        fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_square(acc, acc);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(acc, acc, t15);
    for (i = 0; i < 6; i++)
        fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_square(acc, acc);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(acc, acc, t13);
    for (i = 0; i < 5; i++)
        fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_square(acc, acc);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(acc, acc, t13);
    for (i = 0; i < 6; i++)
        fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_square(acc, acc);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(acc, acc, t1);
    for (i = 0; i < 5; i++)
        fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_square(acc, acc);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(acc, acc, t25);
    for (i = 0; i < 8; i++)
        fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_square(acc, acc);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(acc, acc, t21);
    for (i = 0; i < 5; i++)
        fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_square(acc, acc);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(acc, acc, t11);
    for (i = 0; i < 7; i++)
        fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_square(acc, acc);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(acc, acc, t31);
    for (i = 0; i < 5; i++)
        fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_square(acc, acc);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(acc, acc, t1);
    for (i = 0; i < 5; i++)
        fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_square(acc, acc);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(acc, acc, t3);
    for (i = 0; i < 6; i++)
        fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_square(acc, acc);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(acc, acc, t29);
    for (i = 0; i < 6; i++)
        fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_square(acc, acc);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(acc, acc, t3);
    for (i = 0; i < 6; i++)
        fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_square(acc, acc);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(acc, acc, t15);
    for (i = 0; i < 7; i++)
        fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_square(acc, acc);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(acc, acc, t9);
    for (i = 0; i < 8; i++)
        fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_square(acc, acc);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(acc, acc, t5);
    for (i = 0; i < 6; i++)
        fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_square(acc, acc);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(acc, acc, t7);
    for (i = 0; i < 6; i++)
        fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_square(acc, acc);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(acc, acc, t19);
    for (i = 0; i < 5; i++)
        fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_square(acc, acc);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(acc, acc, t15);
    for (i = 0; i < 7; i++)
        fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_square(acc, acc);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(acc, acc, t25);
    for (i = 0; i < 5; i++)
        fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_square(acc, acc);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(acc, acc, t17);
    for (i = 0; i < 5; i++)
        fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_square(acc, acc);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(acc, acc, t29);
    for (i = 0; i < 5; i++)
        fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_square(acc, acc);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(acc, acc, t29);
    for (i = 0; i < 5; i++)
        fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_square(acc, acc);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(acc, acc, t25);
    for (i = 0; i < 7; i++)
        fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_square(acc, acc);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(acc, acc, t1);
    for (i = 0; i < 7; i++)
        fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_square(acc, acc);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(acc, acc, t11);
    for (i = 0; i < 6; i++)
        fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_square(acc, acc);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(acc, acc, t23);
    for (i = 0; i < 5; i++)
        fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_square(acc, acc);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(acc, acc, t11);
    for (i = 0; i < 7; i++)
        fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_square(acc, acc);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(output, acc, t25);
}